

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  Tls *this_00;
  
  bVar1 = Pool::isTLS(&(this->super_BaseClient).m_pool);
  if (bVar1) {
    this_00 = (Tls *)operator_new(0x878);
    Tls::Tls(this_00,this);
    this->m_tls = this_00;
  }
  iVar2 = resolve(this,&(this->super_BaseClient).m_pool.m_url.m_host);
  return iVar2;
}

Assistant:

void xmrig::Client::connect()
{
#   ifdef XMRIG_FEATURE_TLS
    if (m_pool.isTLS()) {
        m_tls = new Tls(this);
    }
#   endif

    resolve(m_pool.host());
}